

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_vote.cxx
# Opt level: O2

bool __thiscall nuraft::raft_server::check_cond_for_zp_election(raft_server *this)

{
  uint64_t uVar1;
  bool bVar2;
  ptr<raft_params> params;
  element_type *local_20;
  
  nuraft::context::get_params((context *)&stack0xffffffffffffffe0);
  if (((*(char *)&local_20[9]._vptr_state_mgr == '\x01') && (this->target_priority_ == 1)) &&
     (this->my_priority_ == 0)) {
    uVar1 = timer_helper::get_ms(&this->priority_change_timer_);
    bVar2 = true;
    if ((ulong)((long)*(int *)&local_20[1]._vptr_state_mgr * 0x14) < uVar1) goto LAB_001a3d39;
  }
  bVar2 = false;
LAB_001a3d39:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return bVar2;
}

Assistant:

bool raft_server::check_cond_for_zp_election() {
    ptr<raft_params> params = ctx_->get_params();
    if ( params->allow_temporary_zero_priority_leader_ &&
         target_priority_ == 1 &&
         my_priority_ == 0 &&
         priority_change_timer_.get_ms() >
            (uint64_t)params->heart_beat_interval_ * 20 ) {
        return true;
    }
    return false;
}